

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  byte bVar1;
  int iVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(L->glref).ptr32;
  if (errfunc == 0) {
    pTVar3 = L->top;
    lVar5 = 0;
  }
  else {
    if (errfunc < 1) {
      pTVar3 = L->top;
      pTVar4 = pTVar3 + errfunc;
    }
    else {
      pTVar3 = L->top;
      pTVar4 = (TValue *)(uVar6 + 0x68);
      if (L->base + ((ulong)(uint)errfunc - 1) < pTVar3) {
        pTVar4 = L->base + ((ulong)(uint)errfunc - 1);
      }
    }
    lVar5 = (long)pTVar4 - (ulong)(L->stack).ptr32;
  }
  bVar1 = *(byte *)(uVar6 + 0x91);
  iVar2 = lj_vm_pcall(L,pTVar3 + -(long)nargs,nresults + 1,lVar5);
  if (iVar2 != 0) {
    *(byte *)(uVar6 + 0x91) = *(byte *)(uVar6 + 0x91) & 0xf | bVar1 & 0xf0;
  }
  return iVar2;
}

Assistant:

LUA_API int lua_pcall(lua_State *L, int nargs, int nresults, int errfunc)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  ptrdiff_t ef;
  int status;
  api_check(L, L->status == 0 || L->status == LUA_ERRERR);
  api_checknelems(L, nargs+1);
  if (errfunc == 0) {
    ef = 0;
  } else {
    cTValue *o = stkindex2adr(L, errfunc);
    api_checkvalidindex(L, o);
    ef = savestack(L, o);
  }
  status = lj_vm_pcall(L, L->top - nargs, nresults+1, ef);
  if (status) hook_restore(g, oldh);
  return status;
}